

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O1

bool __thiscall
draco::RAnsSymbolDecoder<13>::Create(RAnsSymbolDecoder<13> *this,DecoderBuffer *buffer)

{
  long lVar1;
  byte bVar2;
  pointer puVar3;
  uint *puVar4;
  pointer prVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  vector<draco::rans_sym,_std::allocator<draco::rans_sym>_> *this_00;
  int extra_bytes;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  
  if (buffer->bitstream_version_ == 0) {
    return false;
  }
  if (buffer->bitstream_version_ < 0x200) {
    if (buffer->data_size_ < buffer->pos_ + 4) {
      return false;
    }
    this->num_symbols_ = *(uint32_t *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = buffer->pos_ + 4;
  }
  else {
    bVar23 = anon_unknown_52::DecodeVarintUnsigned<unsigned_int>(1,&this->num_symbols_,buffer);
    if (!bVar23) {
      return false;
    }
  }
  if (buffer->data_size_ - buffer->pos_ < (long)(ulong)(this->num_symbols_ >> 6)) {
    return false;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->probability_table_,(ulong)this->num_symbols_);
  if (this->num_symbols_ == 0) {
    return true;
  }
  uVar11 = this->num_symbols_;
  bVar23 = uVar11 != 0;
  if (bVar23) {
    lVar18 = buffer->data_size_;
    puVar3 = (this->probability_table_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = 0;
    lVar15 = buffer->pos_;
    do {
      lVar14 = lVar15 + 1;
      uVar16 = uVar17;
      if (lVar18 < lVar14) {
LAB_00159e64:
        bVar22 = false;
        lVar14 = lVar15;
      }
      else {
        bVar10 = buffer->data_[lVar15];
        buffer->pos_ = lVar14;
        uVar12 = bVar10 & 3;
        uVar20 = (uint)(bVar10 >> 2);
        if (uVar12 == 3) {
          uVar12 = uVar20 + uVar17;
          bVar22 = uVar12 < uVar11;
          if (bVar22) {
            uVar21 = (ulong)(uVar20 + 1);
            do {
              puVar3[uVar17] = 0;
              uVar17 = uVar17 + 1;
              uVar21 = uVar21 - 1;
              uVar16 = uVar12;
            } while (uVar21 != 0);
          }
        }
        else {
          bVar22 = (bVar10 & 3) != 0;
          lVar15 = lVar14;
          if (bVar22) {
            bVar10 = 6;
            uVar11 = 1;
            do {
              lVar1 = lVar14 + 1;
              lVar15 = lVar14;
              if (lVar18 < lVar1) break;
              bVar2 = buffer->data_[lVar14];
              buffer->pos_ = lVar1;
              uVar20 = uVar20 | (uint)bVar2 << (bVar10 & 0x1f);
              bVar22 = uVar11 < uVar12;
              bVar10 = bVar10 + 8;
              bVar24 = uVar11 != uVar12;
              lVar15 = lVar1;
              lVar14 = lVar1;
              uVar11 = uVar11 + 1;
            } while (bVar24);
          }
          if (bVar22) goto LAB_00159e64;
          puVar3[uVar17] = uVar20;
          bVar22 = true;
          lVar14 = lVar15;
        }
      }
      if (!bVar22) {
        if (bVar23) {
          return false;
        }
        break;
      }
      uVar17 = uVar16 + 1;
      uVar11 = this->num_symbols_;
      bVar23 = uVar17 < uVar11;
      lVar15 = lVar14;
    } while (bVar23);
  }
  puVar4 = (this->probability_table_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar21 = (ulong)this->num_symbols_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&(this->ans_).lut_table_,0x80000)
  ;
  this_00 = &(this->ans_).probability_table_;
  std::vector<draco::rans_sym,_std::allocator<draco::rans_sym>_>::resize(this_00,uVar21);
  bVar23 = uVar21 == 0;
  if (!bVar23) {
    prVar5 = (this_00->super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->ans_).lut_table_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar5->prob = *puVar4;
    prVar5->cum_prob = 0;
    auVar8 = _DAT_00163890;
    auVar7 = _DAT_001623f0;
    auVar6 = _DAT_001623e0;
    uVar9 = 0;
    bVar23 = false;
    if (0x80000 < *puVar4) goto LAB_0015a0f0;
    uVar13 = 0;
    uVar11 = *puVar4;
    do {
      if ((uint)uVar9 < uVar11) {
        lVar18 = (uVar11 - uVar9) + -1;
        auVar25._8_4_ = (int)lVar18;
        auVar25._0_8_ = lVar18;
        auVar25._12_4_ = (int)((ulong)lVar18 >> 0x20);
        auVar25 = auVar25 ^ auVar7;
        uVar19 = 0;
        do {
          auVar27._8_4_ = (int)uVar19;
          auVar27._0_8_ = uVar19;
          auVar27._12_4_ = (int)(uVar19 >> 0x20);
          auVar28 = (auVar27 | auVar6) ^ auVar7;
          iVar26 = auVar25._4_4_;
          uVar17 = (uint)uVar13;
          if ((bool)(~(iVar26 < auVar28._4_4_ ||
                      auVar25._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar26) & 1)) {
            puVar3[uVar9 + uVar19] = uVar17;
          }
          if (auVar28._12_4_ <= auVar25._12_4_ &&
              (auVar28._8_4_ <= auVar25._8_4_ || auVar28._12_4_ != auVar25._12_4_)) {
            puVar3[uVar9 + uVar19 + 1] = uVar17;
          }
          auVar27 = (auVar27 | auVar8) ^ auVar7;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar26 && (iVar29 != iVar26 || auVar27._0_4_ <= auVar25._0_4_)) {
            puVar3[uVar9 + uVar19 + 2] = uVar17;
            puVar3[uVar9 + uVar19 + 3] = uVar17;
          }
          uVar19 = uVar19 + 4;
        } while (((uVar11 - uVar9) + 3 & 0xfffffffffffffffc) != uVar19);
      }
      uVar13 = uVar13 + 1;
      if (uVar13 == uVar21) {
        uVar9 = (ulong)(uVar21 <= uVar13);
        bVar23 = uVar11 == 0x80000;
        goto LAB_0015a0f0;
      }
      prVar5[uVar13].prob = puVar4[uVar13];
      prVar5[uVar13].cum_prob = uVar11;
      uVar17 = puVar4[uVar13] + uVar11;
      uVar9 = (ulong)uVar11;
      uVar11 = uVar17;
    } while (uVar17 < 0x80001);
    bVar23 = uVar21 <= uVar13;
  }
  uVar9 = (ulong)bVar23;
  bVar23 = false;
LAB_0015a0f0:
  return (bool)((byte)uVar9 & bVar23);
}

Assistant:

uint16_t bitstream_version() const { return bitstream_version_; }